

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promises.cpp
# Opt level: O0

shared_ptr<SchemeObject> make_promise(shared_ptr<ASTNode> *body,Context *context)

{
  initializer_list<ASTNode> __l;
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<SchemeObject> sVar3;
  ASTNode *local_e0;
  shared_ptr<SchemeCompoundProcedure> local_a8;
  ASTNode *local_98;
  ASTNode local_90;
  iterator local_50;
  size_type local_48;
  undefined1 local_30 [8];
  shared_ptr<SchemeCompoundProcedure> f;
  Context *context_local;
  shared_ptr<ASTNode> *body_local;
  
  f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX;
  std::make_shared<SchemeCompoundProcedure>();
  peVar1 = std::
           __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  Context::operator=(&peVar1->context,
                     (Context *)
                     f.super___shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  local_98 = &local_90;
  peVar2 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      context);
  ASTNode::ASTNode(&local_90,peVar2);
  local_50 = &local_90;
  local_48 = 1;
  peVar1 = std::
           __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::__cxx11::list<ASTNode,_std::allocator<ASTNode>_>::operator=(&peVar1->body,__l);
  local_e0 = (ASTNode *)&local_50;
  do {
    local_e0 = local_e0 + -1;
    ASTNode::~ASTNode(local_e0);
  } while (local_e0 != &local_90);
  std::make_shared<SchemePromise,std::shared_ptr<SchemeCompoundProcedure>&>(&local_a8);
  std::shared_ptr<SchemeObject>::shared_ptr<SchemePromise,void>
            ((shared_ptr<SchemeObject> *)body,(shared_ptr<SchemePromise> *)&local_a8);
  std::shared_ptr<SchemePromise>::~shared_ptr((shared_ptr<SchemePromise> *)&local_a8);
  std::shared_ptr<SchemeCompoundProcedure>::~shared_ptr
            ((shared_ptr<SchemeCompoundProcedure> *)local_30);
  sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)body;
  return (shared_ptr<SchemeObject>)
         sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<SchemeObject> make_promise(std::shared_ptr<ASTNode> body, const Context &context)
{
    auto f = std::make_shared<SchemeCompoundProcedure>();
    f->context = context;
    f->body = {*body};
    return std::make_shared<SchemePromise>(f);
}